

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_generalized_cepstrum_to_mel_generalized_cepstrum.cc
# Opt level: O2

bool __thiscall
sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::Run
          (MelGeneralizedCepstrumToMelGeneralizedCepstrum *this,
          vector<double,_std::allocator<double>_> *input,
          vector<double,_std::allocator<double>_> *output,Buffer *buffer)

{
  int iVar1;
  pointer ppMVar2;
  size_type __new_size;
  pointer pdVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  pointer __src;
  const_iterator itr;
  pointer ppMVar5;
  bool bVar6;
  
  if (this->is_valid_ == true) {
    bVar6 = false;
    if ((buffer != (Buffer *)0x0) &&
       (bVar6 = false, output != (vector<double,_std::allocator<double>_> *)0x0)) {
      __src = (input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
      pdVar3 = (input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if ((long)pdVar3 - (long)__src >> 3 == (long)this->num_input_order_ + 1) {
        ppMVar5 = (this->modules_).
                  super__Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (ppMVar5 ==
            (this->modules_).
            super__Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          __new_size = (long)this->num_output_order_ + 1;
          if ((long)(output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3 != __new_size) {
            std::vector<double,_std::allocator<double>_>::resize(output,__new_size);
            __src = (input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
            pdVar3 = (input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          }
          bVar6 = true;
          if ((long)pdVar3 - (long)__src != 0) {
            memmove((output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start,__src,(long)pdVar3 - (long)__src);
          }
        }
        else {
          do {
            bVar6 = ppMVar5 ==
                    (this->modules_).
                    super__Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
            if (bVar6) {
              return bVar6;
            }
            ppMVar2 = ppMVar5;
            if (ppMVar5 !=
                (this->modules_).
                super__Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              std::_Vector_base<double,_std::allocator<double>_>::_Vector_impl_data::_M_swap_data
                        ((_Vector_impl_data *)output,
                         (_Vector_impl_data *)&buffer->temporary_mel_generalized_cepstrum_);
              ppMVar2 = (this->modules_).
                        super__Vector_base<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*,_std::allocator<sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::ModuleInterface_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            pvVar4 = &buffer->temporary_mel_generalized_cepstrum_;
            if (ppMVar5 == ppMVar2) {
              pvVar4 = input;
            }
            iVar1 = (*(*ppMVar5)->_vptr_ModuleInterface[3])
                              (*ppMVar5,pvVar4,output,&buffer->frequency_transform_buffer_);
            ppMVar5 = ppMVar5 + 1;
          } while ((char)iVar1 != '\0');
        }
      }
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool MelGeneralizedCepstrumToMelGeneralizedCepstrum::Run(
    const std::vector<double>& input, std::vector<double>* output,
    MelGeneralizedCepstrumToMelGeneralizedCepstrum::Buffer* buffer) const {
  if (!is_valid_ ||
      input.size() != static_cast<std::size_t>(num_input_order_ + 1) ||
      NULL == output || NULL == buffer) {
    return false;
  }

  if (modules_.empty()) {
    if (output->size() != static_cast<std::size_t>(num_output_order_ + 1)) {
      output->resize(num_output_order_ + 1);
    }
    std::copy(input.begin(), input.end(), output->begin());
    return true;
  }

  for (std::vector<MelGeneralizedCepstrumToMelGeneralizedCepstrum::
                       ModuleInterface*>::const_iterator itr(modules_.begin());
       itr != modules_.end(); ++itr) {
    if (itr != modules_.begin()) {
      output->swap(buffer->temporary_mel_generalized_cepstrum_);
    }
    if (!(*itr)->Run((itr == modules_.begin())
                         ? input
                         : buffer->temporary_mel_generalized_cepstrum_,
                     output, &(buffer->frequency_transform_buffer_))) {
      return false;
    }
  }

  return true;
}